

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O1

void __thiscall
App<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::run
          (App<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  char *__command;
  string des;
  string src;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  dist;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  prev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\n888b     d888 8888888888 88888888888 8888888b.   .d88888b.            8888888888 Y88b   d88P  .d88888b.  8888888b.  888     888  .d8888b.\n8888b   d8888 888            888     888   Y88b d88P\" \"Y88b           888         Y88b d88P  d88P\" \"Y88b 888  \"Y88b 888     888 d88P  Y88b\n88888b.d88888 888            888     888    888 888     888           888          Y88o88P   888     888 888    888 888     888 Y88b.\n888Y88888P888 8888888        888     888   d88P 888     888           8888888       Y888P    888     888 888    888 888     888  \"Y888b.\n888 Y888P 888 888            888     8888888P\"  888     888           888           d888b    888     888 888    888 888     888     \"Y88b.\n888  Y8P  888 888            888     888 T88b   888     888           888          d88888b   888     888 888    888 888     888       \"888\n888   \"   888 888            888     888  T88b  Y88b. .d88P           888         d88P Y88b  Y88b. .d88P 888  .d88P Y88b. .d88P Y88b  d88P\n888       888 8888888888     888     888   T88b  \"Y88888P\"            8888888888 d88P   Y88b  \"Y88888P\"  8888888P\"   \"Y88888P\"   \"Y8888P\"\n\n                                                                                                                       @github.com/sar0603"
             ,0x4db);
  local_90._M_impl._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_90,1);
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  get_input(this,&local_170,&local_190);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_170._M_dataplus._M_p,
             local_170._M_dataplus._M_p + local_170._M_string_length);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_190._M_dataplus._M_p,
             local_190._M_dataplus._M_p + local_190._M_string_length);
  bVar1 = uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          print_adj(&this->metro,&local_d0,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    dijkstra_sssp(&this->metro,&local_f0,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                   *)&local_90,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Distance from ",0xe);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_170._M_dataplus._M_p,local_170._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," to ",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_190._M_dataplus._M_p,local_190._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," - ",3);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                           *)&local_90,&local_190);
    poVar2 = std::ostream::_M_insert<double>((double)*pmVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," Kms",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t\tPath: ",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,local_190._M_dataplus._M_p,
               local_190._M_dataplus._M_p + local_190._M_string_length);
    uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    dijkstra_get_sssp(&this->metro,&local_110,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    make_dot_file(&this->metro);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,local_190._M_dataplus._M_p,
               local_190._M_dataplus._M_p + local_190._M_string_length);
    uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    calc_price(&this->metro,&local_130,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    system("dot -Tpng finalmap.dot -o path.png");
    __command = "gnome-terminal  -- sh -c \"fim --autowindow path.png\"";
  }
  else {
    system("zenity --error --title \"Error Occured\" --text=\'Invalid Station Entered\'");
    __command = "clear";
  }
  system(__command);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,
                    CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                             local_190.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

void run() {
      display_welcome();
      map<ver, float> dist;
      map<ver, ver> prev;
      string src, des;
      get_input(src, des);

      bool res = metro.print_adj(src, des);
      if (!res) {//error handling
        handle_error();
        return;
      }
      metro.dijkstra_sssp(src, dist, prev);
      cout << endl << "\t\t";
      cout << "Distance from " << src << " to " << des << " - " << dist[des] << " Kms" << endl;
      cout << endl << "\t\tPath: " << endl;
      metro.dijkstra_get_sssp(des, prev);
      metro.make_dot_file();
      metro.calc_price(src, des);
      display_output();
    }